

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTestsNamesOnly(Config *config)

{
  bool bVar1;
  int iVar2;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *config_00;
  reference pTVar3;
  ostream *poVar4;
  long *in_RDI;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  size_t matchedTests;
  TestSpec testSpec;
  SourceLineInfo *in_stack_ffffffffffffff38;
  size_t sVar5;
  string *in_stack_ffffffffffffff40;
  ostream *in_stack_ffffffffffffff50;
  TestSpec *in_stack_ffffffffffffff90;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff98;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_60;
  undefined1 *local_58;
  undefined1 local_40 [24];
  size_t local_28;
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x60))();
  TestSpec::TestSpec((TestSpec *)in_stack_ffffffffffffff40,(TestSpec *)in_stack_ffffffffffffff38);
  local_28 = 0;
  config_00 = getAllTestCasesSorted((IConfig *)0x1218a9);
  filterTests(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(IConfig *)config_00);
  local_58 = local_40;
  local_60._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_ffffffffffffff38);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_ffffffffffffff38)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::
             __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&local_60);
    local_28 = local_28 + 1;
    bVar1 = startsWith(in_stack_ffffffffffffff40,(char)((ulong)in_stack_ffffffffffffff38 >> 0x38));
    if (bVar1) {
      poVar4 = cout();
      poVar4 = std::operator<<(poVar4,'\"');
      poVar4 = std::operator<<(poVar4,(string *)pTVar3);
      std::operator<<(poVar4,'\"');
    }
    else {
      poVar4 = cout();
      std::operator<<(poVar4,(string *)pTVar3);
    }
    iVar2 = (**(code **)(*local_8 + 0xa0))();
    if (1 < iVar2) {
      in_stack_ffffffffffffff50 = cout();
      std::operator<<(in_stack_ffffffffffffff50,"\t@");
      operator<<((ostream *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    in_stack_ffffffffffffff40 = (string *)cout();
    std::ostream::operator<<(in_stack_ffffffffffffff40,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_60);
  }
  sVar5 = local_28;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_ffffffffffffff50)
  ;
  TestSpec::~TestSpec((TestSpec *)0x121ab5);
  return sVar5;
}

Assistant:

std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            matchedTests++;
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"';
            else
               Catch::cout() << testCaseInfo.name;
            if ( config.verbosity() >= Verbosity::High )
                Catch::cout() << "\t@" << testCaseInfo.lineInfo;
            Catch::cout() << std::endl;
        }
        return matchedTests;
    }